

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_regexp_Symbol_split(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSShape *sh;
  int64_t iVar1;
  JSValueUnion JVar2;
  JSValue JVar3;
  JSValue JVar4;
  JSValue JVar5;
  uint uVar6;
  int iVar7;
  JSValueUnion JVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int64_t iVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue str2;
  JSValue r;
  JSValue JVar16;
  JSValue JVar17;
  JSValue s;
  JSValue s_00;
  JSValue val;
  uint32_t lim;
  int64_t e;
  int64_t numberOfCaptures;
  JSValueUnion local_e0;
  uint local_d4;
  ulong local_c8;
  JSValueUnion local_c0;
  uint local_b0;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  int64_t local_98;
  JSValueUnion local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  if ((int)this_val.tag != -1) {
    JVar8.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not an object");
    iVar12 = 6;
    goto LAB_00143202;
  }
  local_c0.float64 = local_c0.float64 & 0xffffffff00000000;
  JVar13 = JS_ToStringInternal(ctx,*argv,0);
  iVar12 = JVar13.tag;
  JVar8 = JVar13.u;
  JVar17 = JVar13;
  local_60 = JVar8;
  if ((int)JVar13.tag == 6) {
    JVar16 = (JSValue)(ZEXT816(3) << 0x40);
    str2.tag = 3;
    str2.u.ptr = local_c0.ptr;
    JVar15 = (JSValue)(ZEXT816(3) << 0x40);
    uVar11 = 0;
    r = (JSValue)(ZEXT816(3) << 0x40);
    JVar14 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0014304f:
    JVar8.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar11 << 0x20);
    if ((0xfffffff4 < (uint)JVar15.tag) &&
       (iVar7 = *JVar8.ptr, *(int *)JVar8.ptr = iVar7 + -1, iVar7 < 2)) {
      JVar15.tag = JVar15.tag;
      JVar15.u.ptr = JVar8.ptr;
      __JS_FreeValueRT(ctx->rt,JVar15);
    }
    JVar15 = (JSValue)(ZEXT816(6) << 0x40);
    uVar11 = 0;
    JVar13 = JVar17;
  }
  else {
    JVar14 = JS_SpeciesConstructor(ctx,this_val,ctx->regexp_ctor);
    if ((int)JVar14.tag == 6) {
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      str2.tag = 3;
      str2.u.ptr = local_c0.ptr;
      JVar15 = (JSValue)(ZEXT816(3) << 0x40);
      uVar11 = 0;
      r = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_0014304f;
    }
    JVar15 = JS_GetPropertyInternal(ctx,this_val,0x6d,this_val,0);
    str2 = JS_ToStringFree(ctx,JVar15);
    if ((int)str2.tag == 6) {
LAB_00142ed7:
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      JVar15 = (JSValue)(ZEXT816(3) << 0x40);
      uVar11 = 0;
      r = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_0014304f;
    }
    uVar6 = string_indexof_char((JSString *)str2.u.ptr,0x75,0);
    iVar7 = string_indexof_char((JSString *)str2.u.ptr,0x79,0);
    if ((iVar7 < 0) && (str2 = JS_ConcatString3(ctx,"",str2,"y"), (int)str2.tag == 6))
    goto LAB_00142ed7;
    local_58 = this_val.u;
    local_50 = this_val.tag;
    _local_48 = str2;
    r = JS_CallConstructorInternal(ctx,JVar14,JVar14,2,(JSValue *)&local_58,2);
    if ((int)r.tag == 6) {
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      JVar15 = (JSValue)(ZEXT816(3) << 0x40);
      uVar11 = 0;
      goto LAB_0014304f;
    }
    sh = ctx->array_shape;
    (sh->header).ref_count = (sh->header).ref_count + 1;
    JVar15 = JS_NewObjectFromShape(ctx,sh,2);
    uVar11 = (ulong)JVar15.u.ptr >> 0x20;
    if ((int)JVar15.tag == 6) {
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_0014304f;
    }
    iVar1 = argv[1].tag;
    uVar10 = (uint)iVar1;
    if (uVar10 == 3) {
      local_b0 = 0xffffffff;
LAB_001432a1:
      uVar10 = (uint)*(ulong *)((long)local_60.ptr + 4);
      local_ac = uVar10 & 0x7fffffff;
      local_90.float64 = local_60.float64;
      if ((*(ulong *)((long)local_60.ptr + 4) & 0x7fffffff) == 0) {
        s_00.tag = iVar12;
        s_00.u.ptr = local_60.ptr;
        JVar16 = JS_RegExpExec(ctx,r,s_00);
        if ((int)JVar16.tag != 2) {
          if ((int)JVar16.tag == 6) goto LAB_0014304f;
          goto LAB_001430c5;
        }
        local_c8 = 0;
        local_d4 = 0;
      }
      else {
        local_78 = (ulong)(uVar10 & 0x7fffffff);
        local_80 = (ulong)local_b0;
        local_70 = 2 - local_80;
        JVar16 = (JSValue)(ZEXT816(3) << 0x40);
        local_d4 = 0;
        uVar9 = 0;
        local_c8 = 0;
        local_98 = iVar12;
        do {
          val.tag = 0;
          val.u = (JSValueUnion)(uVar9 & 0xffffffff);
          iVar7 = JS_SetPropertyInternal(ctx,r,0x55,val,0x4000);
          if (iVar7 < 0) {
            JVar17.tag = local_98;
            JVar17.u.ptr = JVar8.ptr;
            goto LAB_0014304f;
          }
          local_a8 = uVar9 & 0xffffffff;
          JS_FreeValue(ctx,JVar16);
          JVar2 = local_90;
          iVar12 = local_98;
          JVar17.tag = local_98;
          JVar17.u.ptr = JVar8.ptr;
          JVar4.tag = local_98;
          JVar4.u.ptr = JVar8.ptr;
          JVar3.tag = local_98;
          JVar3.u.ptr = JVar8.ptr;
          s.tag = local_98;
          s.u.ptr = local_90.ptr;
          JVar16 = JS_RegExpExec(ctx,r,s);
          if ((int)JVar16.tag == 2) {
LAB_00143435:
            uVar9 = string_advance_index((JSString *)JVar2.ptr,local_a8,~uVar6 >> 0x1f);
          }
          else {
            if ((int)JVar16.tag == 6) goto LAB_0014304f;
            JVar17 = JS_GetPropertyInternal(ctx,r,0x55,r,0);
            iVar7 = JS_ToLengthFree(ctx,(int64_t *)&local_88,JVar17);
            JVar17 = JVar3;
            if (iVar7 != 0) goto LAB_0014304f;
            if ((long)local_78 <= (long)local_88) {
              local_88 = local_78;
            }
            if (local_88 == local_d4) goto LAB_00143435;
            local_a0 = local_88;
            JVar13 = js_sub_string(ctx,(JSString *)JVar2.ptr,local_d4,(int)local_a8);
            JVar17 = JVar4;
            if ((int)JVar13.tag == 6) goto LAB_0014304f;
            iVar7 = JS_DefinePropertyValueInt64(ctx,JVar15,local_c8,JVar13,0x4007);
            if (iVar7 < 0) goto LAB_0014367e;
            local_c8 = local_c8 + 1;
            if (local_c8 == local_80) {
              JVar13.tag = iVar12;
              JVar13.u.ptr = JVar8.ptr;
              goto LAB_001430c5;
            }
            iVar7 = js_get_length64(ctx,(int64_t *)&local_68,JVar16);
            if (iVar7 != 0) goto LAB_0014367e;
            local_a8 = local_68;
            if ((long)local_68 < 2) {
              local_d4 = (uint)local_a0;
              uVar9 = local_a0;
            }
            else {
              uVar9 = 1;
              do {
                JVar5.tag = iVar12;
                JVar5.u.ptr = JVar8.ptr;
                JVar17.tag = iVar12;
                JVar13 = JS_GetPropertyInt64(ctx,JVar16,uVar9);
                JVar13 = JS_ToStringFree(ctx,JVar13);
                if ((int)JVar13.tag == 6) goto LAB_0014304f;
                iVar7 = JS_DefinePropertyValueInt64(ctx,JVar15,local_c8,JVar13,0x4007);
                JVar17 = JVar5;
                if (iVar7 < 0) goto LAB_0014304f;
                if (local_70 + local_c8 == 1) {
                  JVar13.tag = iVar12;
                  JVar13.u.ptr = JVar8.ptr;
                  goto LAB_001430c5;
                }
                uVar9 = uVar9 + 1;
                local_c8 = local_c8 + 1;
              } while (local_a8 != uVar9);
              local_d4 = (uint)local_a0;
              uVar9 = local_a0;
            }
          }
        } while ((uint)uVar9 < local_ac);
      }
      if (local_ac <= local_d4) {
        local_d4 = local_ac;
      }
      JVar17 = js_sub_string(ctx,(JSString *)local_90.ptr,local_d4,local_ac);
      if ((int)JVar17.tag == 6) {
LAB_0014367e:
        JVar17.tag = iVar12;
        JVar17.u.ptr = JVar8.ptr;
        goto LAB_0014304f;
      }
      iVar7 = JS_DefinePropertyValueInt64(ctx,JVar15,local_c8,JVar17,0x4007);
      JVar13.tag = iVar12;
      JVar13.u.ptr = JVar8.ptr;
      JVar17.tag = iVar12;
      JVar17.u.ptr = JVar8.ptr;
      if (iVar7 < 0) goto LAB_0014304f;
    }
    else {
      JVar2 = (JSValueUnion)argv[1].u.ptr;
      if (0xfffffff4 < uVar10) {
        *(int *)JVar2.ptr = *JVar2.ptr + 1;
      }
      JVar16.tag = iVar1;
      JVar16.u.ptr = JVar2.ptr;
      iVar7 = JS_ToInt32Free(ctx,(int32_t *)&local_b0,JVar16);
      if (iVar7 < 0) {
        JVar16 = (JSValue)(ZEXT816(3) << 0x40);
        goto LAB_0014367e;
      }
      if (local_b0 != 0) goto LAB_001432a1;
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
    }
  }
LAB_001430c5:
  local_c0 = str2.u;
  local_e0 = JVar16.u;
  if ((0xfffffff4 < (uint)JVar13.tag) &&
     (iVar7 = *JVar13.u.ptr, *(int *)JVar13.u.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar13);
  }
  iVar12 = JVar15.tag;
  if ((0xfffffff4 < (uint)JVar14.tag) &&
     (iVar7 = *JVar14.u.ptr, *(int *)JVar14.u.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar14);
  }
  if ((0xfffffff4 < (uint)r.tag) && (iVar7 = *r.u.ptr, *(int *)r.u.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,r);
  }
  if ((0xfffffff4 < (uint)str2.tag) &&
     (iVar7 = *local_c0.ptr, *(int *)local_c0.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,str2);
  }
  if ((0xfffffff4 < (uint)JVar16.tag) &&
     (iVar7 = *local_e0.ptr, *(int *)local_e0.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar16);
  }
  JVar8.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar11 << 0x20);
LAB_00143202:
  JVar14.tag = iVar12;
  JVar14.u.ptr = JVar8.ptr;
  return JVar14;
}

Assistant:

static JSValue js_regexp_Symbol_split(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    // [Symbol.split](str, limit)
    JSValueConst rx = this_val;
    JSValueConst args[2];
    JSValue str, ctor, splitter, A, flags, z, sub;
    JSString *strp;
    uint32_t lim, size, p, q;
    int unicodeMatching;
    int64_t lengthA, e, numberOfCaptures, i;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    ctor = JS_UNDEFINED;
    splitter = JS_UNDEFINED;
    A = JS_UNDEFINED;
    flags = JS_UNDEFINED;
    z = JS_UNDEFINED;
    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;
    ctor = JS_SpeciesConstructor(ctx, rx, ctx->regexp_ctor);
    if (JS_IsException(ctor))
        goto exception;
    flags = JS_ToStringFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_flags));
    if (JS_IsException(flags))
        goto exception;
    strp = JS_VALUE_GET_STRING(flags);
    unicodeMatching = string_indexof_char(strp, 'u', 0) >= 0;
    if (string_indexof_char(strp, 'y', 0) < 0) {
        flags = JS_ConcatString3(ctx, "", flags, "y");
        if (JS_IsException(flags))
            goto exception;
    }
    args[0] = rx;
    args[1] = flags;
    splitter = JS_CallConstructor(ctx, ctor, 2, args);
    if (JS_IsException(splitter))
        goto exception;
    A = JS_NewArray(ctx);
    if (JS_IsException(A))
        goto exception;
    lengthA = 0;
    if (JS_IsUndefined(argv[1])) {
        lim = 0xffffffff;
    } else {
        if (JS_ToUint32(ctx, &lim, argv[1]) < 0)
            goto exception;
        if (lim == 0)
            goto done;
    }
    strp = JS_VALUE_GET_STRING(str);
    p = q = 0;
    size = strp->len;
    if (size == 0) {
        z = JS_RegExpExec(ctx, splitter, str);
        if (JS_IsException(z))
            goto exception;
        if (JS_IsNull(z))
            goto add_tail;
        goto done;
    }
    while (q < size) {
        if (JS_SetProperty(ctx, splitter, JS_ATOM_lastIndex, JS_NewInt32(ctx, q)) < 0)
            goto exception;
        JS_FreeValue(ctx, z);    
        z = JS_RegExpExec(ctx, splitter, str);
        if (JS_IsException(z))
            goto exception;
        if (JS_IsNull(z)) {
            q = string_advance_index(strp, q, unicodeMatching);
        } else {
            if (JS_ToLengthFree(ctx, &e, JS_GetProperty(ctx, splitter, JS_ATOM_lastIndex)))
                goto exception;
            if (e > size)
                e = size;
            if (e == p) {
                q = string_advance_index(strp, q, unicodeMatching);
            } else {
                sub = js_sub_string(ctx, strp, p, q);
                if (JS_IsException(sub))
                    goto exception;
                if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub,
                                                JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
                if (lengthA == lim)
                    goto done;
                p = e;
                if (js_get_length64(ctx, &numberOfCaptures, z))
                    goto exception;
                for(i = 1; i < numberOfCaptures; i++) {
                    sub = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, z, i));
                    if (JS_IsException(sub))
                        goto exception;
                    if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                    if (lengthA == lim)
                        goto done;
                }
                q = p;
            }
        }
    }
add_tail:
    if (p > size)
        p = size;
    sub = js_sub_string(ctx, strp, p, size);
    if (JS_IsException(sub))
        goto exception;
    if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
        goto exception;
    goto done;
exception:
    JS_FreeValue(ctx, A);
    A = JS_EXCEPTION;
done:
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, ctor);
    JS_FreeValue(ctx, splitter);
    JS_FreeValue(ctx, flags);
    JS_FreeValue(ctx, z);    
    return A;
}